

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_0::MaybeRestartJavaMethod
               (Printer *printer,int *bytecode_estimate,int *method_num,char *chain_statement,
               char *method_decl)

{
  char *text;
  int *this;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum local_e0;
  string local_b0;
  AlphaNum local_80;
  string local_50;
  char *local_30;
  char *method_decl_local;
  char *chain_statement_local;
  int *method_num_local;
  int *bytecode_estimate_local;
  Printer *printer_local;
  
  if (0x8000 < *bytecode_estimate) {
    *method_num = *method_num + 1;
    local_30 = method_decl;
    method_decl_local = chain_statement;
    chain_statement_local = (char *)method_num;
    method_num_local = bytecode_estimate;
    bytecode_estimate_local = (int *)printer;
    strings::AlphaNum::AlphaNum(&local_80,*method_num);
    StrCat_abi_cxx11_(&local_50,(protobuf *)&local_80,a);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,chain_statement,(char (*) [11])"method_num",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Outdent((Printer *)bytecode_estimate_local);
    io::Printer::Print<>((Printer *)bytecode_estimate_local,"}\n");
    this = bytecode_estimate_local;
    text = local_30;
    strings::AlphaNum::AlphaNum(&local_e0,*(int *)chain_statement_local);
    StrCat_abi_cxx11_(&local_b0,(protobuf *)&local_e0,a_00);
    io::Printer::Print<char[11],std::__cxx11::string>
              ((Printer *)this,text,(char (*) [11])"method_num",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    io::Printer::Indent((Printer *)bytecode_estimate_local);
    *method_num_local = 0;
  }
  return;
}

Assistant:

void MaybeRestartJavaMethod(io::Printer* printer, int* bytecode_estimate,
                            int* method_num, const char* chain_statement,
                            const char* method_decl) {
  // The goal here is to stay under 64K bytes of jvm bytecode/method,
  // since otherwise we hit a hardcoded limit in the jvm and javac will
  // then fail with the error "code too large". This limit lets our
  // estimates be off by a factor of two and still we're okay.
  static const int bytesPerMethod = kMaxStaticSize;

  if ((*bytecode_estimate) > bytesPerMethod) {
    ++(*method_num);
    printer->Print(chain_statement, "method_num", StrCat(*method_num));
    printer->Outdent();
    printer->Print("}\n");
    printer->Print(method_decl, "method_num", StrCat(*method_num));
    printer->Indent();
    *bytecode_estimate = 0;
  }
}